

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall c4::yml::Parser::_handle_val_anchors_and_refs(Parser *this)

{
  Location LVar1;
  csubstr anchor_00;
  csubstr s;
  csubstr s_00;
  csubstr s_01;
  csubstr s_02;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  Parser *in_RDI;
  csubstr anchor;
  csubstr rem;
  char msg [31];
  Parser *in_stack_000002b0;
  csubstr in_stack_000002b8;
  size_t in_stack_fffffffffffffde8;
  Tree *in_stack_fffffffffffffdf0;
  size_t in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  char in_stack_fffffffffffffe17;
  basic_substring<const_char> *in_stack_fffffffffffffe18;
  LineContents **i;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 uVar5;
  Tree *in_stack_fffffffffffffe58;
  pfn_error in_stack_fffffffffffffe60;
  basic_substring<char_const> local_180 [16];
  LineContents *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  char *pcVar6;
  size_t in_stack_fffffffffffffec8;
  Parser *in_stack_fffffffffffffed0;
  LineContents *local_110;
  char *local_108;
  basic_substring<const_char> local_100;
  size_t local_f0;
  Tree *pTStack_e8;
  undefined8 local_e0;
  size_t sStack_d8;
  char *local_d0;
  undefined1 local_c8 [47];
  bool local_99;
  csubstr *local_98;
  char *local_90;
  undefined4 local_88;
  pfn_allocate local_80;
  LineContents **local_78;
  LineContents *local_70;
  char *local_68;
  size_t local_60;
  Tree *local_58;
  NodeData *local_50;
  size_t local_48;
  Tree *local_40;
  char *local_38;
  undefined4 local_30;
  char *local_28;
  basic_substring<const_char> *local_20;
  LineContents *local_18;
  char *local_10;
  NodeData *local_8;
  
  bVar2 = has_any(in_RDI,0x40);
  if (bVar2) {
    local_c8[0] = 'c';
    local_c8[1] = 'h';
    local_c8[2] = 'e';
    local_c8[3] = 'c';
    local_c8[4] = 'k';
    local_c8[5] = ' ';
    local_c8[6] = 'f';
    local_c8[7] = 'a';
    local_c8[8] = 'i';
    local_c8[9] = 'l';
    local_c8[10] = 'e';
    local_c8[0xb] = 'd';
    local_c8[0xc] = ':';
    local_c8[0xd] = ' ';
    local_c8[0xe] = '(';
    local_c8[0xf] = '!';
    local_c8[0x10] = 'h';
    local_c8[0x11] = 'a';
    local_c8[0x12] = 's';
    local_c8[0x13] = '_';
    local_c8[0x14] = 'a';
    local_c8[0x15] = 'n';
    local_c8[0x16] = 'y';
    local_c8[0x17] = '(';
    local_c8._24_4_ = 0x59454b52;
    local_c8._28_2_ = 0x2929;
    local_c8[0x1e] = 0;
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    in_stack_fffffffffffffe60 = (in_RDI->m_stack).m_callbacks.m_error;
    in_stack_fffffffffffffe58 = (Tree *)local_c8;
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8
                       ,(size_t)in_stack_fffffffffffffdf0);
    LVar1.super_LineCol.line = (size_t)pTStack_e8;
    LVar1.super_LineCol.offset = local_f0;
    LVar1.super_LineCol.col = local_e0;
    LVar1.name.str = (char *)sStack_d8;
    LVar1.name.len = (size_t)local_d0;
    (*in_stack_fffffffffffffe60)
              ((char *)in_stack_fffffffffffffe58,0x1f,LVar1,
               (in_RDI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffde8 = local_f0;
    in_stack_fffffffffffffdf0 = pTStack_e8;
    in_stack_fffffffffffffe00 = sStack_d8;
    in_stack_fffffffffffffe08 = local_d0;
  }
  local_100.str = (in_RDI->m_state->line_contents).rem.str;
  local_100.len = (in_RDI->m_state->line_contents).rem.len;
  bVar2 = basic_substring<const_char>::begins_with(&local_100,'&');
  if (bVar2) {
    local_28 = (char *)basic_substring<const_char>::first_of
                                 (in_stack_fffffffffffffe18,in_stack_fffffffffffffe17,
                                  (size_t)in_stack_fffffffffffffe08);
    local_20 = &local_100;
    uVar5 = local_28 <= local_100.len || local_28 == (char *)0xffffffffffffffff;
    if (local_28 > local_100.len && local_28 != (char *)0xffffffffffffffff) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) &&
         (in_stack_fffffffffffffe47 = is_debugger_attached(), (bool)in_stack_fffffffffffffe47)) {
        trap_instruction();
      }
      local_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_30 = 0x1569;
      handle_error(0x3fa1ef,(char *)0x1569,"check failed: %s","pos <= len || pos == npos");
    }
    if (local_28 == (char *)0xffffffffffffffff) {
      local_18 = (LineContents *)local_100.str;
      local_10 = (char *)local_100.len;
    }
    else {
      basic_substring<const_char>::basic_substring
                ((basic_substring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    }
    local_110 = local_18;
    local_108 = local_10;
    _line_progressed(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    i = &local_110;
    local_80 = (pfn_allocate)0x1;
    local_78 = i;
    if (local_108 == (char *)0x0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x1533;
      handle_error(0x3fa1ef,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              ((basic_substring<const_char> *)
               CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    local_110 = local_70;
    local_108 = local_68;
    local_98 = &in_RDI->m_val_anchor;
    bVar2 = true;
    if ((in_RDI->m_val_anchor).len != 0) {
      bVar2 = local_98->str == (char *)0x0;
    }
    if (bVar2) {
      (in_RDI->m_val_anchor).str = (char *)local_70;
      (in_RDI->m_val_anchor).len = (size_t)local_68;
      s.len = in_stack_fffffffffffffea0;
      s.str = in_stack_fffffffffffffe98;
      sVar4 = LineContents::current_col(in_stack_fffffffffffffe90,s);
      in_RDI->m_val_anchor_indentation = sVar4;
    }
    else {
      local_58 = in_RDI->m_tree;
      local_60 = in_RDI->m_state->node_id;
      local_50 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                          (size_t)i);
      if (((local_50->m_type).type & SEQ) != NOTYPE) {
        bVar2 = Tree::has_children(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
        if (bVar2) {
          (in_RDI->m_key_anchor).str = (char *)local_110;
          (in_RDI->m_key_anchor).len = (size_t)local_108;
          s_00.len = in_stack_fffffffffffffea0;
          s_00.str = in_stack_fffffffffffffe98;
          sVar4 = LineContents::current_col(in_stack_fffffffffffffe90,s_00);
          in_RDI->m_key_anchor_indentation = sVar4;
        }
        else {
          local_40 = in_RDI->m_tree;
          local_48 = in_RDI->m_state->node_id;
          local_8 = Tree::_p((Tree *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                             (size_t)i);
          bVar2 = false;
          if (((local_8->m_type).type & VALANCH) != NOTYPE) {
            bVar2 = ((local_8->m_type).type & (SEQ|MAP|VAL)) != NOTYPE;
          }
          if (bVar2) {
            (in_RDI->m_key_anchor).str = (char *)local_110;
            (in_RDI->m_key_anchor).len = (size_t)local_108;
            s_01.len = in_stack_fffffffffffffea0;
            s_01.str = in_stack_fffffffffffffe98;
            sVar4 = LineContents::current_col(in_stack_fffffffffffffe90,s_01);
            in_RDI->m_key_anchor_indentation = sVar4;
          }
          else {
            pcVar6 = (in_RDI->m_val_anchor).str;
            anchor_00.len = (size_t)in_RDI;
            anchor_00.str = (char *)in_stack_fffffffffffffe60;
            Tree::set_val_anchor
                      (in_stack_fffffffffffffe58,CONCAT17(uVar5,in_stack_fffffffffffffe50),anchor_00
                      );
            (in_RDI->m_val_anchor).str = (char *)local_110;
            (in_RDI->m_val_anchor).len = (size_t)local_108;
            s_02.len = (size_t)pcVar6;
            s_02.str = (char *)local_100.len;
            sVar4 = LineContents::current_col((LineContents *)local_100.str,s_02);
            in_RDI->m_val_anchor_indentation = sVar4;
          }
        }
      }
    }
    local_99 = true;
  }
  else {
    bVar2 = basic_substring<const_char>::begins_with(&local_100,'*');
    if (bVar2) {
      bVar2 = is_debugger_attached();
      if ((bVar2) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      basic_substring<char_const>::basic_substring<65ul>
                (local_180,
                 (char (*) [65])"ERROR: not implemented - this should have been catched elsewhere");
      _err<>(in_stack_000002b0,in_stack_000002b8);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x71d9,"never reach this point");
    }
    local_99 = false;
  }
  return local_99;
}

Assistant:

bool Parser::_handle_val_anchors_and_refs()
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, !has_any(RKEY));
    const csubstr rem = m_state->line_contents.rem;
    if(rem.begins_with('&'))
    {
        csubstr anchor = rem.left_of(rem.first_of(' '));
        _line_progressed(anchor.len);
        anchor = anchor.sub(1); // skip the first character
        _c4dbgpf("val: found an anchor: '{}', indentation={}!!!", anchor, m_state->line_contents.current_col(rem));
        if(m_val_anchor.empty())
        {
            _c4dbgpf("save val anchor: '{}'", anchor);
            m_val_anchor = anchor;
            m_val_anchor_indentation = m_state->line_contents.current_col(rem);
        }
        else
        {
            _c4dbgpf("there is a pending val anchor '{}'", m_val_anchor);
            if(m_tree->is_seq(m_state->node_id))
            {
                if(m_tree->has_children(m_state->node_id))
                {
                    _c4dbgpf("current node={} is a seq, has {} children", m_state->node_id, m_tree->num_children(m_state->node_id));
                    _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                    m_key_anchor = anchor;
                    m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                }
                else
                {
                    _c4dbgpf("current node={} is a seq, has no children", m_state->node_id);
                    if(m_tree->has_val_anchor(m_state->node_id))
                    {
                        _c4dbgpf("... node={} already has val anchor: '{}'", m_state->node_id, m_tree->val_anchor(m_state->node_id));
                        _c4dbgpf("... so take the new one as a key anchor '{}'", anchor);
                        m_key_anchor = anchor;
                        m_key_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                    else
                    {
                        _c4dbgpf("... so set pending val anchor: '{}' on current node {}", m_val_anchor, m_state->node_id);
                        m_tree->set_val_anchor(m_state->node_id, m_val_anchor);
                        m_val_anchor = anchor;
                        m_val_anchor_indentation = m_state->line_contents.current_col(rem);
                    }
                }
            }
        }
        return true;
    }
    else if(C4_UNLIKELY(rem.begins_with('*')))
    {
        _c4err("not implemented - this should have been catched elsewhere");
        C4_NEVER_REACH();
        return false;
    }
    return false;
}